

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpc_parse_fold(mpc_input_t *i,mpc_fold_t f,int n,mpc_val_t **xs)

{
  void *pvVar1;
  int local_34;
  int j;
  mpc_val_t **xs_local;
  int n_local;
  mpc_fold_t f_local;
  mpc_input_t *i_local;
  
  if (f == mpcf_null) {
    i_local = (mpc_input_t *)mpcf_null(n,xs);
  }
  else if (f == mpcf_fst) {
    i_local = (mpc_input_t *)mpcf_fst(n,xs);
  }
  else if (f == mpcf_snd) {
    i_local = (mpc_input_t *)mpcf_snd(n,xs);
  }
  else if (f == mpcf_trd) {
    i_local = (mpc_input_t *)mpcf_trd(n,xs);
  }
  else if (f == mpcf_fst_free) {
    i_local = (mpc_input_t *)mpcf_input_fst_free(i,n,xs);
  }
  else if (f == mpcf_snd_free) {
    i_local = (mpc_input_t *)mpcf_input_snd_free(i,n,xs);
  }
  else if (f == mpcf_trd_free) {
    i_local = (mpc_input_t *)mpcf_input_trd_free(i,n,xs);
  }
  else if (f == mpcf_strfold) {
    i_local = (mpc_input_t *)mpcf_input_strfold(i,n,xs);
  }
  else if (f == mpcf_state_ast) {
    i_local = (mpc_input_t *)mpcf_input_state_ast(i,n,xs);
  }
  else {
    for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
      pvVar1 = mpc_export(i,xs[local_34]);
      xs[local_34] = pvVar1;
    }
    i_local = (mpc_input_t *)(*f)(local_34,xs);
  }
  return i_local;
}

Assistant:

static mpc_val_t *mpc_parse_fold(mpc_input_t *i, mpc_fold_t f, int n, mpc_val_t **xs) {
  int j;
  if (f == mpcf_null)      { return mpcf_null(n, xs); }
  if (f == mpcf_fst)       { return mpcf_fst(n, xs); }
  if (f == mpcf_snd)       { return mpcf_snd(n, xs); }
  if (f == mpcf_trd)       { return mpcf_trd(n, xs); }
  if (f == mpcf_fst_free)  { return mpcf_input_fst_free(i, n, xs); }
  if (f == mpcf_snd_free)  { return mpcf_input_snd_free(i, n, xs); }
  if (f == mpcf_trd_free)  { return mpcf_input_trd_free(i, n, xs); }
  if (f == mpcf_strfold)   { return mpcf_input_strfold(i, n, xs); }
  if (f == mpcf_state_ast) { return mpcf_input_state_ast(i, n, xs); }
  for (j = 0; j < n; j++) { xs[j] = mpc_export(i, xs[j]); }
  return f(j, xs);
}